

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

errr Term_curs_x11(wchar_t x,wchar_t y)

{
  void *pvVar1;
  term_data *td;
  wchar_t y_local;
  wchar_t x_local;
  
  pvVar1 = Term->data;
  XDrawRectangle(Metadpy->dpy,Infowin->win,xor->gc,
                 x * *(int *)((long)pvVar1 + 0xe8) + (int)Infowin->ox,
                 y * *(int *)((long)pvVar1 + 0xf0) + (int)Infowin->oy,
                 *(int *)((long)pvVar1 + 0xe8) + -1,*(int *)((long)pvVar1 + 0xf0) + -1);
  return 0;
}

Assistant:

static errr Term_curs_x11(int x, int y)
{
	term_data *td = (term_data*)(Term->data);

	XDrawRectangle(Metadpy->dpy, Infowin->win, xor->gc,
				   x * td->tile_wid + Infowin->ox,
				   y * td->tile_hgt + Infowin->oy,
				   td->tile_wid - 1, td->tile_hgt - 1);

	/* Success */
	return (0);
}